

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O0

size_t SzArEx_GetFileNameUtf16(CSzArEx *p,size_t fileIndex,UInt16 *dest)

{
  size_t sVar1;
  Byte *pBVar2;
  ulong uVar3;
  Byte *src;
  size_t i;
  size_t len;
  size_t offs;
  UInt16 *dest_local;
  size_t fileIndex_local;
  CSzArEx *p_local;
  
  sVar1 = p->FileNameOffsets[fileIndex];
  uVar3 = p->FileNameOffsets[fileIndex + 1] - sVar1;
  if (dest != (UInt16 *)0x0) {
    pBVar2 = p->FileNames;
    for (i = 0; i < uVar3; i = i + 1) {
      dest[i] = *(UInt16 *)(pBVar2 + i * 2 + sVar1 * 2);
    }
  }
  return uVar3;
}

Assistant:

size_t SzArEx_GetFileNameUtf16(const CSzArEx *p, size_t fileIndex, UInt16 *dest)
{
  size_t offs = p->FileNameOffsets[fileIndex];
  size_t len = p->FileNameOffsets[fileIndex + 1] - offs;
  if (dest != 0)
  {
    size_t i;
    const Byte *src = p->FileNames + offs * 2;
    for (i = 0; i < len; i++)
      dest[i] = GetUi16(src + i * 2);
  }
  return len;
}